

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O2

int lh_table_delete_entry(lh_table *t,lh_entry *e)

{
  lh_entry *plVar1;
  lh_entry *plVar2;
  int iVar3;
  lh_entry *plVar4;
  long lVar5;
  
  plVar4 = t->table;
  lVar5 = (long)e - (long)plVar4;
  if (lVar5 < 0) {
    iVar3 = -2;
  }
  else if (*(ulong *)((long)plVar4 + lVar5) < 0xfffffffffffffffe) {
    t->count = t->count + -1;
    if (t->free_fn != (lh_entry_free_fn *)0x0) {
      (*t->free_fn)(e);
      plVar4 = t->table;
    }
    plVar1 = (lh_entry *)((long)plVar4 + lVar5);
    *(undefined8 *)((long)plVar4 + lVar5 + 0x10) = 0;
    *(undefined8 *)((long)plVar4 + lVar5) = 0xfffffffffffffffe;
    plVar4 = t->head;
    if (t->tail == plVar1) {
      if (plVar4 == plVar1) {
        t->head = (lh_entry *)0x0;
        t->tail = (lh_entry *)0x0;
      }
      else {
        plVar4 = t->tail->prev;
        plVar4->next = (lh_entry *)0x0;
        t->tail = plVar4;
      }
    }
    else if (plVar4 == plVar1) {
      plVar4 = plVar4->next;
      plVar4->prev = (lh_entry *)0x0;
      t->head = plVar4;
    }
    else {
      plVar4 = plVar1->next;
      plVar2 = plVar1->prev;
      plVar2->next = plVar4;
      plVar4->prev = plVar2;
    }
    plVar1->next = (lh_entry *)0x0;
    plVar1->prev = (lh_entry *)0x0;
    iVar3 = 0;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int lh_table_delete_entry(struct lh_table *t, struct lh_entry *e)
{
	/* CAW: fixed to be 64bit nice, still need the crazy negative case... */
	ptrdiff_t n = (ptrdiff_t)(e - t->table);

	/* CAW: this is bad, really bad, maybe stack goes other direction on this machine... */
	if (n < 0)
	{
		return -2;
	}

	if (t->table[n].k == LH_EMPTY || t->table[n].k == LH_FREED)
		return -1;
	t->count--;
	if (t->free_fn)
		t->free_fn(e);
	t->table[n].v = NULL;
	t->table[n].k = LH_FREED;
	if (t->tail == &t->table[n] && t->head == &t->table[n])
	{
		t->head = t->tail = NULL;
	}
	else if (t->head == &t->table[n])
	{
		t->head->next->prev = NULL;
		t->head = t->head->next;
	}
	else if (t->tail == &t->table[n])
	{
		t->tail->prev->next = NULL;
		t->tail = t->tail->prev;
	}
	else
	{
		t->table[n].prev->next = t->table[n].next;
		t->table[n].next->prev = t->table[n].prev;
	}
	t->table[n].next = t->table[n].prev = NULL;
	return 0;
}